

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O0

int Sbd_ManImplement(Sbd_Man_t *p,int Pivot,word Truth)

{
  Gia_Man_t *pGVar1;
  Vec_Int_t *pVVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint Entry_00;
  bool bVar7;
  int iNewLev;
  int iCurLev;
  int iObjLast;
  int Node;
  int Entry;
  int iLit;
  int w;
  int k;
  int i;
  Gia_Obj_t *pObj;
  word Truth_local;
  Sbd_Man_t *pSStack_10;
  int Pivot_local;
  Sbd_Man_t *p_local;
  
  pObj = (Gia_Obj_t *)Truth;
  Truth_local._4_4_ = Pivot;
  pSStack_10 = p;
  iVar3 = Gia_ManObjNum(p->pGia);
  iVar4 = Vec_IntEntry(pSStack_10->vLutLevs,Truth_local._4_4_);
  Vec_IntClear(pSStack_10->vLits);
  for (w = 0; iVar5 = Vec_IntSize(pSStack_10->vDivSet), w < iVar5; w = w + 1) {
    iVar5 = Vec_IntEntry(pSStack_10->vDivSet,w);
    iVar5 = Vec_IntEntry(pSStack_10->vWinObjs,iVar5);
    iVar6 = Vec_IntEntry(pSStack_10->vMirrors,iVar5);
    if (iVar6 < 0) {
      pVVar2 = pSStack_10->vLits;
      iVar5 = Abc_Var2Lit(iVar5,0);
      Vec_IntPush(pVVar2,iVar5);
    }
    else {
      pVVar2 = pSStack_10->vLits;
      iVar5 = Vec_IntEntry(pSStack_10->vMirrors,iVar5);
      Vec_IntPush(pVVar2,iVar5);
    }
  }
  if ((pSStack_10->pGia->nXors != 0) && (pSStack_10->pGia->pMuxes == (uint *)0x0)) {
    pSStack_10->pGia->pMuxes = (uint *)pSStack_10;
  }
  Entry_00 = Dsm_ManTruthToGia(pSStack_10->pGia,(word *)&pObj,pSStack_10->vLits,pSStack_10->vCover);
  if ((Sbd_Man_t *)pSStack_10->pGia->pMuxes == pSStack_10) {
    pSStack_10->pGia->pMuxes = (uint *)0x0;
  }
  iVar5 = Vec_IntEntry(pSStack_10->vMirrors,Truth_local._4_4_);
  if (iVar5 != -1) {
    __assert_fail("Vec_IntEntry(p->vMirrors, Pivot) == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCore.c"
                  ,0x70e,"int Sbd_ManImplement(Sbd_Man_t *, int, word)");
  }
  Vec_IntWriteEntry(pSStack_10->vMirrors,Truth_local._4_4_,Entry_00);
  if (pSStack_10->pPars->fVerbose != 0) {
    printf("Replacing node %d by literal %d.\n",(ulong)Truth_local._4_4_,(ulong)Entry_00);
  }
  for (w = 0; iVar5 = Vec_IntSize(pSStack_10->vLits), w < iVar5; w = w + 1) {
    iVar5 = Vec_IntEntry(pSStack_10->vLits,w);
    pVVar2 = pSStack_10->vLits;
    iVar5 = Abc_Lit2Var(iVar5);
    Vec_IntWriteEntry(pVVar2,w,iVar5);
  }
  w = 0;
  while( true ) {
    iVar5 = Vec_IntSize(pSStack_10->vLits);
    bVar7 = false;
    if (w < iVar5) {
      pGVar1 = pSStack_10->pGia;
      iVar5 = Vec_IntEntry(pSStack_10->vLits,w);
      _k = Gia_ManObj(pGVar1,iVar5);
      bVar7 = _k != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    *(ulong *)_k = *(ulong *)_k & 0xffffffffbfffffff | 0x40000000;
    w = w + 1;
  }
  iVar5 = Vec_IntSize(pSStack_10->vLutLevs);
  w = iVar3;
  if (iVar5 == iVar3) {
    for (; iVar3 = Gia_ManObjNum(pSStack_10->pGia), w < iVar3; w = w + 1) {
      Vec_IntPush(pSStack_10->vLutLevs,0);
      Vec_IntPush(pSStack_10->vObj2Var,0);
      Vec_IntPush(pSStack_10->vMirrors,-1);
      pVVar2 = pSStack_10->vLutCuts;
      iVar3 = Vec_IntSize(pSStack_10->vLutCuts);
      Vec_IntFillExtra(pVVar2,iVar3 + pSStack_10->pPars->nLutSize + 1,0);
      Sbd_ManFindCut(pSStack_10,w,pSStack_10->vLits);
      for (iLit = 0; iLit < 4; iLit = iLit + 1) {
        for (Entry = 0; Entry < pSStack_10->pPars->nWords; Entry = Entry + 1) {
          Vec_WrdPush(pSStack_10->vSims[iLit],0);
        }
      }
    }
    w = 0;
    while( true ) {
      iVar3 = Vec_IntSize(pSStack_10->vLits);
      bVar7 = false;
      if (w < iVar3) {
        pGVar1 = pSStack_10->pGia;
        iVar3 = Vec_IntEntry(pSStack_10->vLits,w);
        _k = Gia_ManObj(pGVar1,iVar3);
        bVar7 = _k != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      *(ulong *)_k = *(ulong *)_k & 0xffffffffbfffffff;
      w = w + 1;
    }
    pVVar2 = pSStack_10->vLutLevs;
    iVar3 = Abc_Lit2Var(Entry_00);
    iVar3 = Vec_IntEntry(pVVar2,iVar3);
    if (iVar3 < iVar4) {
      iVar5 = Vec_IntEntry(pSStack_10->vLutLevs,Truth_local._4_4_);
      if (iVar5 == iVar4) {
        Vec_IntWriteEntry(pSStack_10->vLutLevs,Truth_local._4_4_,iVar3);
        return 0;
      }
      __assert_fail("Vec_IntEntry(p->vLutLevs, Pivot) == iCurLev",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCore.c"
                    ,0x72c,"int Sbd_ManImplement(Sbd_Man_t *, int, word)");
    }
    __assert_fail("iNewLev < iCurLev",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCore.c"
                  ,0x72a,"int Sbd_ManImplement(Sbd_Man_t *, int, word)");
  }
  __assert_fail("Vec_IntSize(p->vLutLevs) == iObjLast",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCore.c"
                ,0x719,"int Sbd_ManImplement(Sbd_Man_t *, int, word)");
}

Assistant:

int Sbd_ManImplement( Sbd_Man_t * p, int Pivot, word Truth )
{
    Gia_Obj_t * pObj;
    int i, k, w, iLit, Entry, Node;
    int iObjLast = Gia_ManObjNum(p->pGia);
    int iCurLev = Vec_IntEntry(p->vLutLevs, Pivot);
    int iNewLev;
    // collect leaf literals
    Vec_IntClear( p->vLits );
    Vec_IntForEachEntry( p->vDivSet, Node, i )
    {
        Node = Vec_IntEntry( p->vWinObjs, Node );
        if ( Vec_IntEntry(p->vMirrors, Node) >= 0 )
            Vec_IntPush( p->vLits, Vec_IntEntry(p->vMirrors, Node) );
        else
            Vec_IntPush( p->vLits, Abc_Var2Lit(Node, 0) );
    }
    // pretend to have MUXes
//    assert( p->pGia->pMuxes == NULL );
    if ( p->pGia->nXors && p->pGia->pMuxes == NULL )
        p->pGia->pMuxes = (unsigned *)p;
    // derive new function of the node
    iLit = Dsm_ManTruthToGia( p->pGia, &Truth, p->vLits, p->vCover );
    if ( p->pGia->pMuxes == (unsigned *)p )
        p->pGia->pMuxes = NULL;
    // remember this function
    assert( Vec_IntEntry(p->vMirrors, Pivot) == -1 );
    Vec_IntWriteEntry( p->vMirrors, Pivot, iLit );
    if ( p->pPars->fVerbose )
        printf( "Replacing node %d by literal %d.\n", Pivot, iLit );
    // translate literals into variables
    Vec_IntForEachEntry( p->vLits, Entry, i )
        Vec_IntWriteEntry( p->vLits, i, Abc_Lit2Var(Entry) );
    // label inputs
    Gia_ManForEachObjVec( p->vLits, p->pGia, pObj, i )
        pObj->fMark0 = 1;
    // extend data-structure to accommodate new nodes
    assert( Vec_IntSize(p->vLutLevs) == iObjLast );
    for ( i = iObjLast; i < Gia_ManObjNum(p->pGia); i++ )
    {
        Vec_IntPush( p->vLutLevs, 0 );
        Vec_IntPush( p->vObj2Var, 0 );
        Vec_IntPush( p->vMirrors, -1 );
        Vec_IntFillExtra( p->vLutCuts, Vec_IntSize(p->vLutCuts) + p->pPars->nLutSize + 1, 0 );
        Sbd_ManFindCut( p, i, p->vLits );
        for ( k = 0; k < 4; k++ )
            for ( w = 0; w < p->pPars->nWords; w++ )
                Vec_WrdPush( p->vSims[k], 0 );
    }
    // unlabel inputs
    Gia_ManForEachObjVec( p->vLits, p->pGia, pObj, i )
        pObj->fMark0 = 0;
    // make sure delay reduction is achieved
    iNewLev = Vec_IntEntry( p->vLutLevs, Abc_Lit2Var(iLit) );
    assert( iNewLev < iCurLev );
    // update delay of the initial node
    assert( Vec_IntEntry(p->vLutLevs, Pivot) == iCurLev );
    Vec_IntWriteEntry( p->vLutLevs, Pivot, iNewLev );
    //Vec_IntWriteEntry( p->vLevs, Pivot, 1+Abc_MaxInt(Vec_IntEntry(p->vLevs, Gia_ObjFaninId0(pObj, Pivot)), Vec_IntEntry(p->vLevs, Gia_ObjFaninId1(pObj, Pivot))) );
    return 0;
}